

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O3

int it_riff_am_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len,int ver)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  int32 iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  IT_ENTRY *entry;
  long lVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  bool bVar13;
  
  iVar1 = dumbfile_getc(f);
  iVar12 = iVar1 + 1;
  pattern->n_rows = iVar12;
  pattern->n_entries = 0;
  iVar2 = dumbfile_pos(f);
  lVar10 = (long)len + (long)iVar2 + -1;
  if (-1 < iVar1) {
    bVar11 = false;
    iVar6 = 0;
    do {
      while( true ) {
        iVar3 = dumbfile_error(f);
        if ((iVar3 != 0) || (iVar4 = dumbfile_pos(f), lVar10 <= iVar4)) goto LAB_00713c84;
        uVar5 = dumbfile_getc(f);
        if (uVar5 == 0) break;
        if ((uVar5 & 0xe0) != 0) {
          pattern->n_entries = pattern->n_entries + 1;
          if ((char)uVar5 < '\0') {
            dumbfile_skip(f,2);
          }
          if ((uVar5 & 0x40) != 0) {
            dumbfile_skip(f,2);
          }
          if ((uVar5 & 0x20) != 0) {
            dumbfile_skip(f,1);
          }
        }
        if (bVar11) goto LAB_00713c84;
      }
      bVar13 = iVar6 != iVar1;
      bVar11 = iVar1 <= iVar6;
      iVar6 = iVar6 + 1;
    } while (bVar13);
  }
LAB_00713c84:
  if (pattern->n_entries == 0) {
    iVar12 = 0;
  }
  else {
    iVar6 = pattern->n_entries + iVar12;
    pattern->n_entries = iVar6;
    entry = (IT_ENTRY *)malloc((long)iVar6 * 7);
    pattern->entry = entry;
    if (entry == (IT_ENTRY *)0x0) {
      iVar12 = -1;
    }
    else {
      dumbfile_seek(f,(long)iVar2,0);
      if (iVar1 < 0) {
        iVar6 = 0;
      }
      else {
        bVar11 = false;
        iVar3 = 0;
        do {
          while( true ) {
            iVar7 = dumbfile_error(f);
            iVar6 = iVar3;
            if ((iVar7 != 0) || (iVar2 = dumbfile_pos(f), lVar10 <= iVar2)) goto LAB_00713e3e;
            uVar5 = dumbfile_getc(f);
            if (uVar5 != 0) break;
            entry->channel = 0xff;
            entry = entry + 1;
            bVar13 = iVar3 == iVar1;
            bVar11 = iVar1 <= iVar3;
            iVar6 = iVar12;
            iVar3 = iVar3 + 1;
            if (bVar13) goto LAB_00713e3e;
          }
          entry->channel = (byte)uVar5 & 0x1f;
          entry->mask = '\0';
          if ((uVar5 & 0xe0) != 0) {
            if ((char)(byte)uVar5 < '\0') {
              iVar7 = dumbfile_getc(f);
              iVar8 = dumbfile_getc(f);
              _dumb_it_xm_convert_effect(iVar8,iVar7,entry,0);
            }
            if ((uVar5 & 0x40) != 0) {
              iVar7 = dumbfile_getc(f);
              iVar8 = dumbfile_getc(f);
              if (iVar7 != 0) {
                entry->mask = entry->mask | 2;
                entry->instrument = (uchar)iVar7;
              }
              if (iVar8 != 0) {
                entry->mask = entry->mask | 1;
                entry->note = (char)iVar8 + 0xff;
              }
            }
            if ((uVar5 & 0x20) == 0) {
              lVar9 = 7;
              if (entry->mask == '\0') {
                lVar9 = 0;
              }
            }
            else {
              iVar7 = dumbfile_getc(f);
              entry->mask = entry->mask | 4;
              if (ver == 0) {
                entry->volpan = (uchar)iVar7;
              }
              else {
                lVar9 = (long)(iVar7 << 6) * 0x81020409;
                entry->volpan = (char)(uint)((ulong)lVar9 >> 0x26) - (char)(lVar9 >> 0x3f);
              }
              lVar9 = 7;
            }
            entry = (IT_ENTRY *)(&entry->channel + lVar9);
          }
        } while (!bVar11);
      }
LAB_00713e3e:
      if (iVar6 <= iVar1) {
        iVar12 = (iVar1 - iVar6) + 1;
        do {
          entry->channel = 0xff;
          entry = entry + 1;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      iVar12 = ((int)entry - *(int *)&pattern->entry) * -0x49249249;
      pattern->n_entries = iVar12;
      iVar12 = -(uint)(iVar12 == 0);
    }
  }
  return iVar12;
}

Assistant:

static int it_riff_am_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len, int ver )
{
    int nrows, row;
    long start, end;
	unsigned flags;
    int p, q, r;
	IT_ENTRY * entry;

    nrows = dumbfile_getc( f ) + 1;

	pattern->n_rows = nrows;

	len -= 1;

	pattern->n_entries = 0;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < nrows) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xE0;

        if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 2 );
            if (flags & 0x40) dumbfile_skip( f, 2 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
		}
	}

	if ( ! pattern->n_entries ) return 0;

	pattern->n_entries += nrows;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    dumbfile_seek( f, start, DFS_SEEK_SET );

    while ( ( row < nrows ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );

        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x1F;
		entry->mask = 0;

		if (flags & 0xE0)
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( r, q, entry, 0 );
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
                if ( r )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = r - 1;
				}
			}

			if ( flags & 0x20 )
			{
                q = dumbfile_getc( f );
				entry->mask |= IT_ENTRY_VOLPAN;
                if ( ver == 0 ) entry->volpan = q;
                else entry->volpan = q * 64 / 127;
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < nrows )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}